

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Common.cpp
# Opt level: O2

bool CheckWildCard(char *szString,char *szWildCard)

{
  char cVar1;
  char cVar2;
  bool bVar3;
  char cVar4;
  
  do {
    cVar1 = *szWildCard;
    do {
      if (cVar1 != '*') {
        if (cVar1 == '\0') {
          return *szString == '\0';
        }
        if (cVar1 != '?') {
          cVar4 = *szString;
          if (AsciiToUpperTable_BkSlash[cVar1] != AsciiToUpperTable_BkSlash[cVar4]) {
            return false;
          }
          szWildCard = szWildCard + 1;
          goto LAB_0010cba1;
        }
        if (*szString == '\0') {
          return false;
        }
        szWildCard = szWildCard + 1;
        goto LAB_0010cba6;
      }
      cVar2 = szWildCard[1];
    } while (cVar2 == '*');
    if ((cVar2 == '\0') ||
       ((cVar4 = *szString, AsciiToUpperTable_BkSlash[cVar2] == AsciiToUpperTable_BkSlash[cVar4] &&
        (bVar3 = CheckWildCard(szString,szWildCard + 1), bVar3)))) {
      return true;
    }
LAB_0010cba1:
    if (cVar4 == '\0') {
      return false;
    }
LAB_0010cba6:
    szString = szString + 1;
  } while( true );
}

Assistant:

bool CheckWildCard(const char * szString, const char * szWildCard)
{
    const char * szWildCardPtr;

    for(;;)
    {
        // If there is '?' in the wildcard, we skip one char
        while(szWildCard[0] == '?')
        {
            if(szString[0] == 0)
                return false;

            szWildCard++;
            szString++;
        }

        // Handle '*'
        szWildCardPtr = szWildCard;
        if(szWildCardPtr[0] != 0)
        {
            if(szWildCardPtr[0] == '*')
            {
                szWildCardPtr++;

                if(szWildCardPtr[0] == '*')
                    continue;

                if(szWildCardPtr[0] == 0)
                    return true;

                if(AsciiToUpperTable_BkSlash[szWildCardPtr[0]] == AsciiToUpperTable_BkSlash[szString[0]])
                {
                    if(CheckWildCard(szString, szWildCardPtr))
                        return true;
                }
            }
            else
            {
                if(AsciiToUpperTable_BkSlash[szWildCardPtr[0]] != AsciiToUpperTable_BkSlash[szString[0]])
                    return false;

                szWildCard = szWildCardPtr + 1;
            }

            if(szString[0] == 0)
                return false;
            szString++;
        }
        else
        {
            return (szString[0] == 0) ? true : false;
        }
    }
}